

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *input_file;
  char *output_dir;
  int iVar1;
  int iVar2;
  time_t tVar3;
  char *flags;
  char *sprite_name;
  uint64_t seed;
  char default_flags [25];
  uint64_t local_60;
  char local_58 [40];
  
  builtin_strncpy(local_58 + 0x10,"AAAAAEAA",9);
  builtin_strncpy(local_58,"IVIAAVCAKACAAAAA",0x10);
  printf("DWRandomizer version %s\n","3.0.3 beta 698");
  if (argc < 3) {
    print_usage(*argv,local_58);
    exit(0);
  }
  input_file = argv[1];
  output_dir = argv[(ulong)(uint)argc - 1];
  if (argc == 3) {
    flags = local_58;
  }
  else {
    flags = argv[2];
    if (4 < (uint)argc) {
      iVar1 = __isoc99_sscanf(argv[3],"%lu",&local_60);
      if (iVar1 == 1) goto LAB_001023ba;
    }
  }
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar1 = rand();
  iVar2 = rand();
  local_60 = CONCAT44(iVar1,iVar2);
LAB_001023ba:
  if ((uint)argc < 6) {
    sprite_name = "Random";
  }
  else {
    sprite_name = argv[4];
  }
  printf("Randomizing using seed: %lu with flags %s\n",local_60,flags);
  dwr_randomize(input_file,local_60,flags,sprite_name,output_dir);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    uint64_t seed;
    const char *sprite;
    char *flags;
    char default_flags[] = DEFAULT_FLAGS;
    char *input_file, *output_dir;

    printf("DWRandomizer version %s\n", VERSION);
    if (argc < 3) {
        print_usage(argv[0], default_flags);
        exit(0);
    }

    input_file = argv[1];
    output_dir = argv[argc-1];
    if (argc >= 4) {
        flags = argv[2];
    } else {
        flags = default_flags;
    }
    if (argc < 5 || sscanf(argv[3], "%"PRIu64, &seed) != 1) {
        srand(time(NULL));
        seed = ((uint64_t)rand() << 32) | ((uint64_t)rand() & 0xffffffffL);
    }
    if (argc > 5) {
        sprite = argv[4];
    } else {
        sprite = "Random";
    }

    printf("Randomizing using seed: %"PRIu64" with flags %s\n", seed, flags);

    dwr_randomize(input_file, seed, flags, sprite, output_dir);

    return 0;
}